

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O3

void __thiscall
acto::actor::fun_handler_t<A::M,_acto::actor_ref,_const_A::M_&>::invoke
          (fun_handler_t<A::M,_acto::actor_ref,_const_A::M_&> *this,
          unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *msg)

{
  actor_ref aStack_18;
  
  actor_ref::actor_ref
            (&aStack_18,
             ((msg->_M_t).
              super___uniq_ptr_impl<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>._M_t
              .super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>.
              super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl)->sender,true);
  if ((this->func_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->func_)._M_invoker)
              ((_Any_data *)&this->func_,&aStack_18,
               (M *)(msg->_M_t).
                    super___uniq_ptr_impl<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>
                    .super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl);
    actor_ref::~actor_ref(&aStack_18);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void invoke(std::unique_ptr<core::msg_t> msg) const final {
      if constexpr (sizeof...(Args) == 0) {
        func_();
      } else if constexpr (sizeof...(Args) == 1) {
        using P0 = std::tuple_element_t<0, std::tuple<Args...>>;

        if constexpr (std::is_same_v<actor_ref, std::decay_t<P0>>) {
          func_(actor_ref(msg->sender, true));
        } else {
          func_(static_cast<message_reference_t<M, P0>>(*msg.get()).data());
        }
      } else if constexpr (sizeof...(Args) == 2) {
        using P1 = std::tuple_element_t<1, std::tuple<Args...>>;

        func_(actor_ref(msg->sender, true),
              static_cast<message_reference_t<M, P1>>(*msg.get()).data());
      }
    }